

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O0

bool __thiscall GNUmakeTokenPoolPosix::SetAlarmHandler(GNUmakeTokenPoolPosix *this)

{
  int iVar1;
  undefined1 local_b0 [8];
  sigaction act;
  GNUmakeTokenPoolPosix *this_local;
  
  act.sa_restorer = (_func_void *)this;
  memset(local_b0,0,0x98);
  local_b0 = (undefined1  [8])CloseDupRfd;
  iVar1 = sigaction(0xe,(sigaction *)local_b0,(sigaction *)&this->old_act_);
  if (-1 < iVar1) {
    this->restore_ = true;
  }
  else {
    perror("sigaction:");
  }
  return -1 < iVar1;
}

Assistant:

bool GNUmakeTokenPoolPosix::SetAlarmHandler() {
  struct sigaction act;
  memset(&act, 0, sizeof(act));
  act.sa_handler = CloseDupRfd;
  if (sigaction(SIGALRM, &act, &old_act_) < 0) {
    perror("sigaction:");
    return false;
  }
  restore_ = true;
  return true;
}